

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cave-square.c
# Opt level: O0

_Bool square_isempty(chunk *c,loc_conflict grid)

{
  _Bool _Var1;
  object *poVar2;
  chunk *c_local;
  loc_conflict grid_local;
  
  _Var1 = square_isplayertrap(c,grid);
  if (_Var1) {
    grid_local.x._3_1_ = false;
  }
  else {
    _Var1 = square_iswebbed(c,grid);
    if (_Var1) {
      grid_local.x._3_1_ = false;
    }
    else {
      _Var1 = square_isopen(c,grid);
      grid_local.x._3_1_ = false;
      if (_Var1) {
        poVar2 = square_object(c,grid);
        grid_local.x._3_1_ = poVar2 == (object *)0x0;
      }
    }
  }
  return grid_local.x._3_1_;
}

Assistant:

bool square_isempty(struct chunk *c, struct loc grid) {
	if (square_isplayertrap(c, grid)) return false;
	if (square_iswebbed(c, grid)) return false;
	return square_isopen(c, grid) && !square_object(c, grid);
}